

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O2

void DC8uv_SSE2(uint8_t *dst)

{
  int iVar1;
  long lVar2;
  undefined1 auVar3 [16];
  
  iVar1 = 0;
  for (lVar2 = -1; lVar2 != 0xff; lVar2 = lVar2 + 0x20) {
    iVar1 = iVar1 + (uint)dst[lVar2];
  }
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(dst + -0x20);
  auVar3 = psadbw((undefined1  [16])0x0,auVar3);
  Put8x8uv_SSE2((uint8_t)(iVar1 + auVar3._0_4_ + 8U >> 4),dst);
  return;
}

Assistant:

static void DC8uv_SSE2(uint8_t* dst) {     // DC
  const __m128i zero = _mm_setzero_si128();
  const __m128i top = _mm_loadl_epi64((const __m128i*)(dst - BPS));
  const __m128i sum = _mm_sad_epu8(top, zero);
  int left = 0;
  int j;
  for (j = 0; j < 8; ++j) {
    left += dst[-1 + j * BPS];
  }
  {
    const int DC = _mm_cvtsi128_si32(sum) + left + 8;
    Put8x8uv_SSE2(DC >> 4, dst);
  }
}